

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O1

void check_buffer_size(uv_handle_t *handle)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  int value;
  int local_c;
  
  local_c = 0;
  iVar1 = uv_recv_buffer_size(handle,&local_c);
  if (iVar1 == 0) {
    if (local_c < 1) goto LAB_001bad12;
    local_c = 10000;
    iVar1 = uv_recv_buffer_size(handle,&local_c);
    if (iVar1 != 0) goto LAB_001bad21;
    local_c = 0;
    iVar1 = uv_recv_buffer_size(handle,&local_c);
    if (iVar1 == 0) {
      if ((local_c == 10000) || (local_c == 20000)) {
        return;
      }
      goto LAB_001bad3f;
    }
  }
  else {
    check_buffer_size_cold_1();
LAB_001bad12:
    check_buffer_size_cold_2();
LAB_001bad21:
    check_buffer_size_cold_3();
  }
  check_buffer_size_cold_4();
LAB_001bad3f:
  check_buffer_size_cold_5();
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void check_buffer_size(uv_handle_t* handle) {
  int value;

  value = 0;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));
  ASSERT_GT(value, 0);

  value = 10000;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));

  value = 0;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));
  /* linux sets double the value */
  ASSERT(value == 10000 || value == 20000);
}